

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

FileEntryInfo * __thiscall
IsoWriter::getEntryByName(IsoWriter *this,string *name,FileTypes fileType)

{
  int iVar1;
  FileEntryInfo *pFVar2;
  undefined4 extraout_var;
  FileEntryInfo *this_00;
  long lVar3;
  long lVar4;
  bool bVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string fileName;
  
  splitStr_abi_cxx11_(&parts,(name->_M_dataplus)._M_p,'/');
  if (this->m_rootDirInfo == (FileEntryInfo *)0x0) {
    pFVar2 = (FileEntryInfo *)0x0;
  }
  else {
    if ((fileType == SystemStreamDirectory) || (fileType == Directory)) {
      lVar4 = (long)parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
    }
    else {
      lVar4 = ((long)parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) + -1;
    }
    lVar3 = 0;
    this_00 = this->m_rootDirInfo;
    while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
      pFVar2 = FileEntryInfo::subDirByName
                         (this_00,(string *)
                                  ((long)&((parts.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar3));
      if (pFVar2 == (FileEntryInfo *)0x0) {
        iVar1 = mkdir(this,*(char **)((long)&((parts.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar3),(__mode_t)this_00);
        pFVar2 = (FileEntryInfo *)CONCAT44(extraout_var,iVar1);
      }
      lVar3 = lVar3 + 0x20;
      this_00 = pFVar2;
    }
    pFVar2 = (FileEntryInfo *)0x0;
    if ((fileType != Directory) && (fileType != SystemStreamDirectory)) {
      std::__cxx11::string::string
                ((string *)&fileName,
                 (string *)
                 (parts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1));
      pFVar2 = this_00;
      if ((fileName._M_string_length != 0) &&
         (pFVar2 = FileEntryInfo::fileByName(this_00,&fileName), pFVar2 == (FileEntryInfo *)0x0)) {
        pFVar2 = createFileEntry(this,this_00,fileType);
        if (pFVar2 == (FileEntryInfo *)0x0) {
          pFVar2 = (FileEntryInfo *)0x0;
        }
        else {
          std::__cxx11::string::_M_assign((string *)&pFVar2->m_name);
        }
      }
      std::__cxx11::string::~string((string *)&fileName);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parts);
  return pFVar2;
}

Assistant:

FileEntryInfo *IsoWriter::getEntryByName(const std::string &name, const FileTypes fileType)
{
    const std::vector<std::string> parts = splitStr(name.c_str(), '/');
    FileEntryInfo *entry = m_rootDirInfo;
    if (!entry)
        return nullptr;
    const bool isDir = fileType == FileTypes::Directory || fileType == FileTypes::SystemStreamDirectory;
    const size_t idxMax = isDir ? parts.size() : parts.size() - 1;
    for (size_t i = 0; i < idxMax; ++i)
    {
        FileEntryInfo *nextEntry = entry->subDirByName(parts[i]);
        if (!nextEntry)
            nextEntry = mkdir(parts[i].c_str(), entry);
        entry = nextEntry;
    }
    if (isDir)
        return nullptr;

    const std::string fileName = *parts.rbegin();
    if (fileName.empty())
        return entry;
    FileEntryInfo *fileEntry = entry->fileByName(fileName);
    if (!fileEntry)
    {
        fileEntry = createFileEntry(entry, fileType);
        if (!fileEntry)
            return nullptr;
        fileEntry->setName(fileName);
    }

    return fileEntry;
}